

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetItem::setHidden(QTreeWidgetItem *this,bool hide)

{
  QTreeModel *this_00;
  QTreeWidgetPrivate *__s;
  undefined1 in_SIL;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  QTreeModel *model;
  QModelIndex index;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 hidden;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QTreeWidgetItem *in_stack_ffffffffffffffb0;
  undefined3 in_stack_ffffffffffffffbc;
  uint row;
  byte bVar1;
  QTreeWidgetItem *this_01;
  undefined1 local_20 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_10;
  long local_8;
  
  hidden = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  row = CONCAT13(in_SIL,in_stack_ffffffffffffffbc) & 0x1ffffff;
  this_01 = in_RDI;
  this_00 = treeModel(in_stack_ffffffffffffffb0,(QTreeWidget *)in_RDI);
  if (this_00 != (QTreeModel *)0x0) {
    if (in_RDI == this_00->headerItem) {
      QTreeView::header((QTreeView *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      bVar1 = (byte)(row >> 0x18);
      QWidget::setHidden((QWidget *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (bool)hidden);
    }
    else {
      local_20._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_20._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      __s = QTreeWidget::d_func((QTreeWidget *)0x9125bf);
      QTreeWidgetPrivate::index((QTreeWidgetPrivate *)local_20,(char *)__s,(int)in_RDI);
      QModelIndex::row((QModelIndex *)local_20);
      QModelIndex::parent((QModelIndex *)this_00);
      QTreeView::setRowHidden
                ((QTreeView *)this_01,row,(QModelIndex *)this_00,SUB81((ulong)in_RDI >> 0x38,0));
      bVar1 = (byte)(row >> 0x18);
    }
    in_RDI->d->field_0x20 = in_RDI->d->field_0x20 & 0xfb | (bVar1 & 1) << 2;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeWidgetItem::setHidden(bool hide)
{
    const QTreeModel *model = treeModel();
    if (!model)
        return;
    if (this == model->headerItem) {
        view->header()->setHidden(hide);
    } else {
        const QModelIndex index = view->d_func()->index(this);
        view->setRowHidden(index.row(), index.parent(), hide);
    }
    d->hidden = hide;
}